

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

int Ssw_ManProfileConstraints(Aig_Man_t *p,int nWords,int nFrames,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Ptr_t *vInfo;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  abctime aVar15;
  ulong uVar16;
  int nWords_00;
  int iVar17;
  int iVar18;
  ulong uVar19;
  char *p_02;
  float fVar20;
  
  aVar5 = Abc_Clock();
  if (fVerbose != 0) {
    printf("Simulating %d nodes and %d flops for %d frames with %d words... ",
           (ulong)(uint)(p->nObjs[6] + p->nObjs[5]),(ulong)(uint)p->nRegs,(ulong)(uint)nFrames,
           (ulong)(uint)nWords);
  }
  Aig_ManRandom(1);
  vInfo = Vec_PtrAllocSimInfo(p->vObjs->nSize + 2,nWords);
  Vec_PtrCleanSimInfo(vInfo,nWords,nWords_00);
  p_00 = (Vec_Ptr_t *)Vec_IntStart(p->nTruePos);
  p_01 = (Vec_Ptr_t *)Vec_IntStart(p->nTruePos);
  pvVar6 = Vec_PtrEntry(vInfo,p->pConst1->Id);
  uVar16 = 0;
  uVar19 = 0;
  if (0 < nWords) {
    uVar19 = (ulong)(uint)nWords;
  }
  for (; uVar19 != uVar16; uVar16 = uVar16 + 1) {
    *(undefined4 *)((long)pvVar6 + uVar16 * 4) = 0xffffffff;
  }
  for (iVar17 = 0; iVar17 < p->nRegs; iVar17 = iVar17 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar17);
    pvVar6 = Vec_PtrEntry(vInfo,*(int *)((long)pvVar6 + 0x24));
    for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
      *(undefined4 *)((long)pvVar6 + uVar16 * 4) = 0;
    }
  }
  pvVar6 = Vec_PtrEntry(vInfo,p->vObjs->nSize);
  p_02 = (char *)vInfo;
  pvVar7 = Vec_PtrEntry(vInfo,p->vObjs->nSize + 1);
  iVar17 = 0;
  if (0 < nFrames) {
    iVar17 = nFrames;
  }
  for (iVar4 = 0; iVar18 = (int)p_02, iVar4 != iVar17; iVar4 = iVar4 + 1) {
    for (iVar18 = 0; iVar18 < p->nTruePis; iVar18 = iVar18 + 1) {
      pvVar8 = Vec_PtrEntry(p->vCis,iVar18);
      pvVar8 = Vec_PtrEntry(vInfo,*(int *)((long)pvVar8 + 0x24));
      for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        uVar2 = Aig_ManRandom(0);
        *(uint *)((long)pvVar8 + uVar16 * 4) = uVar2;
      }
    }
    for (iVar18 = 0; iVar18 < p->nRegs; iVar18 = iVar18 + 1) {
      pAVar9 = Saig_ManLi(p,iVar18);
      pAVar10 = Saig_ManLo(p,iVar18);
      pvVar8 = Vec_PtrEntry(vInfo,pAVar10->Id);
      pvVar11 = Vec_PtrEntry(vInfo,pAVar9->Id);
      for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        *(undefined4 *)((long)pvVar8 + uVar16 * 4) = *(undefined4 *)((long)pvVar11 + uVar16 * 4);
      }
    }
    for (iVar18 = 0; iVar18 < p->vObjs->nSize; iVar18 = iVar18 + 1) {
      pvVar8 = Vec_PtrEntry(p->vObjs,iVar18);
      if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
        pvVar11 = Vec_PtrEntry(vInfo,*(int *)((long)pvVar8 + 0x24));
        iVar3 = -1;
        if (*(ulong *)((long)pvVar8 + 8) != 0) {
          iVar3 = *(int *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x24);
        }
        pvVar12 = Vec_PtrEntry(vInfo,iVar3);
        iVar3 = -1;
        if (*(ulong *)((long)pvVar8 + 0x10) != 0) {
          iVar3 = *(int *)((*(ulong *)((long)pvVar8 + 0x10) & 0xfffffffffffffffe) + 0x24);
        }
        pvVar13 = Vec_PtrEntry(vInfo,iVar3);
        if ((*(byte *)((long)pvVar8 + 8) & 1) == 0) {
          if ((*(ulong *)((long)pvVar8 + 0x10) & 1) == 0) {
            for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
              *(uint *)((long)pvVar11 + uVar16 * 4) =
                   *(uint *)((long)pvVar13 + uVar16 * 4) & *(uint *)((long)pvVar12 + uVar16 * 4);
            }
          }
          else {
            for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
              *(uint *)((long)pvVar11 + uVar16 * 4) =
                   ~*(uint *)((long)pvVar13 + uVar16 * 4) & *(uint *)((long)pvVar12 + uVar16 * 4);
            }
          }
        }
        else if ((*(ulong *)((long)pvVar8 + 0x10) & 1) == 0) {
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            *(uint *)((long)pvVar11 + uVar16 * 4) =
                 ~*(uint *)((long)pvVar12 + uVar16 * 4) & *(uint *)((long)pvVar13 + uVar16 * 4);
          }
        }
        else {
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            *(uint *)((long)pvVar11 + uVar16 * 4) =
                 ~(*(uint *)((long)pvVar13 + uVar16 * 4) | *(uint *)((long)pvVar12 + uVar16 * 4));
          }
        }
      }
    }
    for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
      *(undefined4 *)((long)pvVar7 + uVar16 * 4) = 0;
      *(undefined4 *)((long)pvVar6 + uVar16 * 4) = 0;
    }
    for (iVar18 = 0; p_02 = (char *)p->vCos, iVar18 < ((Vec_Ptr_t *)p_02)->nSize;
        iVar18 = iVar18 + 1) {
      pvVar8 = Vec_PtrEntry((Vec_Ptr_t *)p_02,iVar18);
      pvVar11 = Vec_PtrEntry(vInfo,*(int *)((long)pvVar8 + 0x24));
      iVar3 = -1;
      if (*(ulong *)((long)pvVar8 + 8) != 0) {
        iVar3 = *(int *)((*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffe) + 0x24);
      }
      pvVar12 = Vec_PtrEntry(vInfo,iVar3);
      if ((iVar18 < p->nTruePos) && (p->nTruePos - p->nConstrs <= iVar18)) {
        if ((*(ulong *)((long)pvVar8 + 8) & 1) == 0) {
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            puVar1 = (uint *)((long)pvVar11 + uVar16 * 4);
            *puVar1 = *puVar1 | *(uint *)((long)pvVar12 + uVar16 * 4);
          }
        }
        else {
          for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
            puVar1 = (uint *)((long)pvVar11 + uVar16 * 4);
            *puVar1 = *puVar1 | ~*(uint *)((long)pvVar12 + uVar16 * 4);
          }
        }
      }
      else if ((*(ulong *)((long)pvVar8 + 8) & 1) == 0) {
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          *(undefined4 *)((long)pvVar11 + uVar16 * 4) = *(undefined4 *)((long)pvVar12 + uVar16 * 4);
        }
      }
      else {
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          *(uint *)((long)pvVar11 + uVar16 * 4) = ~*(uint *)((long)pvVar12 + uVar16 * 4);
        }
      }
      if (iVar18 < p->nTruePos - p->nConstrs) {
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          puVar1 = (uint *)((long)pvVar6 + uVar16 * 4);
          *puVar1 = *puVar1 | *(uint *)((long)pvVar11 + uVar16 * 4);
        }
      }
      else if (iVar18 < p->nTruePos) {
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          puVar1 = (uint *)((long)pvVar7 + uVar16 * 4);
          *puVar1 = *puVar1 | *(uint *)((long)pvVar11 + uVar16 * 4);
        }
      }
    }
    for (iVar18 = 0; iVar18 < p->nTruePos; iVar18 = iVar18 + 1) {
      pvVar8 = Vec_PtrEntry(p->vCos,iVar18);
      p_02 = (char *)vInfo;
      pvVar8 = Vec_PtrEntry(vInfo,*(int *)((long)pvVar8 + 0x24));
      for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        iVar3 = Aig_WordCountOnes(*(uint *)((long)pvVar8 + uVar16 * 4));
        p_02 = (char *)p_00;
        Vec_IntAddToEntry((Vec_Int_t *)p_00,iVar18,iVar3);
      }
      if (iVar18 < p->nTruePos - p->nConstrs) {
        uVar16 = 0;
        while ((uVar14 = uVar19, uVar19 != uVar16 &&
               (uVar14 = uVar16,
               (*(uint *)((long)pvVar8 + uVar16 * 4) & ~*(uint *)((long)pvVar7 + uVar16 * 4)) == 0))
              ) {
          uVar16 = uVar16 + 1;
        }
        if ((int)uVar14 != nWords) {
          p_02 = "Primary output %d fails on some input patterns.\n";
          printf("Primary output %d fails on some input patterns.\n");
        }
      }
      else {
        for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
          iVar3 = Aig_WordCountOnes(*(uint *)((long)pvVar6 + uVar16 * 4) &
                                    *(uint *)((long)pvVar8 + uVar16 * 4));
          p_02 = (char *)p_01;
          Vec_IntAddToEntry((Vec_Int_t *)p_01,iVar18,iVar3);
        }
      }
    }
  }
  if (fVerbose != 0) {
    aVar15 = Abc_Clock();
    Abc_Print(iVar18,"%s =","T");
    Abc_Print(iVar18,"%9.2f sec\n",(double)(aVar15 - aVar5) / 1000000.0);
    fVar20 = (float)(nWords * nFrames * 0x20);
    for (iVar17 = 0; iVar17 < p->nTruePos; iVar17 = iVar17 + 1) {
      pvVar6 = Vec_PtrEntry(p->vCos,iVar17);
      if (iVar17 < p->nTruePos - p->nConstrs) {
        printf("Primary output :  ");
      }
      else {
        printf("Constraint %3d :  ",(ulong)(uint)((p->nConstrs - p->nTruePos) + iVar17));
      }
      iVar4 = Vec_IntEntry((Vec_Int_t *)p_00,iVar17);
      printf("ProbOne = %f  ",(double)((float)iVar4 / fVar20));
      iVar4 = Vec_IntEntry((Vec_Int_t *)p_01,iVar17);
      printf("ProbOneC = %f  ",(double)((float)iVar4 / fVar20));
      printf("AllZeroValue = %d ",(ulong)(*(uint *)((long)pvVar6 + 0x18) >> 3 & 1));
      putchar(10);
    }
  }
  Vec_PtrFree(vInfo);
  Vec_IntFree((Vec_Int_t *)p_00);
  Vec_IntFree((Vec_Int_t *)p_01);
  return 1;
}

Assistant:

int Ssw_ManProfileConstraints( Aig_Man_t * p, int nWords, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vInfo;
    Vec_Int_t * vProbs, * vProbs2;
    Aig_Obj_t * pObj, * pObjLi;
    unsigned * pInfo, * pInfo0, * pInfo1, * pInfoMask, * pInfoMask2;
    int i, w, f, RetValue = 1;
    abctime clk = Abc_Clock();
    if ( fVerbose )
        printf( "Simulating %d nodes and %d flops for %d frames with %d words... ", 
            Aig_ManNodeNum(p), Aig_ManRegNum(p), nFrames, nWords );
    Aig_ManRandom( 1 );
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p)+2, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    vProbs  = Vec_IntStart( Saig_ManPoNum(p) );
    vProbs2 = Vec_IntStart( Saig_ManPoNum(p) );
    // start the constant
    pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(Aig_ManConst1(p)) );
    for ( w = 0; w < nWords; w++ )
        pInfo[w] = ~0;
    // start the flop inputs
    Saig_ManForEachLi( p, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    // get the info mask
    pInfoMask  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p) );    // PO failed
    pInfoMask2 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p)+1 );  // constr failed
    for ( f = 0; f < nFrames; f++ )
    {
        // assign primary inputs
        Saig_ManForEachPi( p, pObj, i )
        {
            pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = Aig_ManRandom( 0 );
        }
        // move the flop values
        Saig_ManForEachLiLo( p, pObjLi, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObjLi) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = pInfo0[w];
        }
        // simulate the nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            pInfo1 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId1(pObj) );
            if ( Aig_ObjFaninC0(pObj) )
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w] & pInfo1[w];
            }
            else 
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & ~pInfo1[w];
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & pInfo1[w];
            }
        }
        // clean the mask
        for ( w = 0; w < nWords; w++ )
            pInfoMask[w] = pInfoMask2[w] = 0;
        // simulate the primary outputs
        Aig_ManForEachCo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) || i >= Saig_ManPoNum(p) )
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w];
                }
            }
            else
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= pInfo0[w];
                }
            }
            // collect patterns when one of the outputs fails
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask[w] |= pInfo[w];
            }
            else if ( i < Saig_ManPoNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask2[w] |= pInfo[w];
            }
        }
        // compare the PO values (mask=1 => out=0) or UNSAT(mask=1 & out=1)
        Saig_ManForEachPo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                Vec_IntAddToEntry( vProbs, i, Aig_WordCountOnes(pInfo[w]) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                // chek the output
                for ( w = 0; w < nWords; w++ )
                    if ( pInfo[w] & ~pInfoMask2[w] ) 
                        break;
                if ( w == nWords )
                    continue;
                printf( "Primary output %d fails on some input patterns.\n", i );
            }
            else
            {
                // collect patterns that block the POs
                for ( w = 0; w < nWords; w++ )
                    Vec_IntAddToEntry( vProbs2, i, Aig_WordCountOnes(pInfo[w] & pInfoMask[w]) );
            }
        }
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    // print the state
    if ( fVerbose )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                printf( "Primary output :  " );
            else
                printf( "Constraint %3d :  ", i-(Saig_ManPoNum(p) - Saig_ManConstrNum(p))  );
            printf( "ProbOne = %f  ",  (float)Vec_IntEntry(vProbs,  i)/(32*nWords*nFrames) );
            printf( "ProbOneC = %f  ", (float)Vec_IntEntry(vProbs2, i)/(32*nWords*nFrames) );
            printf( "AllZeroValue = %d ", Aig_ObjPhase(pObj) );
            printf( "\n" );
        }
    }

    // print the states
    Vec_PtrFree( vInfo );
    Vec_IntFree( vProbs );
    Vec_IntFree( vProbs2 );
    return RetValue;
}